

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegExpEnumerator.cpp
# Opt level: O0

JavascriptString * __thiscall
Js::JavascriptRegExpEnumerator::MoveAndGetNext
          (JavascriptRegExpEnumerator *this,PropertyId *propertyId,PropertyAttributes *attributes)

{
  BOOL BVar1;
  uint uVar2;
  JavascriptRegExpConstructor *pJVar3;
  uint32 index;
  JavascriptRegExpEnumerator *local_38;
  JavascriptString *item;
  ScriptContext *scriptContext;
  PropertyAttributes *attributes_local;
  PropertyId *propertyId_local;
  JavascriptRegExpEnumerator *this_local;
  
  *propertyId = -1;
  scriptContext = (ScriptContext *)attributes;
  attributes_local = (PropertyAttributes *)propertyId;
  propertyId_local = (PropertyId *)this;
  item = (JavascriptString *)RecyclableObject::GetScriptContext((RecyclableObject *)this);
  local_38 = (JavascriptRegExpEnumerator *)0x0;
  pJVar3 = Memory::WriteBarrierPtr<Js::JavascriptRegExpConstructor>::operator->(&this->regExpObject)
  ;
  index = this->index + 1;
  this->index = index;
  BVar1 = JavascriptRegExpConstructor::GetSpecialEnumerablePropertyName
                    (pJVar3,index,(JavascriptString **)&local_38,(ScriptContext *)item);
  if (BVar1 == 0) {
    pJVar3 = Memory::WriteBarrierPtr<Js::JavascriptRegExpConstructor>::operator->
                       (&this->regExpObject);
    uVar2 = JavascriptRegExpConstructor::GetSpecialEnumerablePropertyCount(pJVar3);
    this->index = uVar2;
    this_local = (JavascriptRegExpEnumerator *)0x0;
  }
  else {
    if (scriptContext != (ScriptContext *)0x0) {
      *(undefined1 *)&(scriptContext->super_ScriptContextInfo)._vptr_ScriptContextInfo = 1;
    }
    this_local = local_38;
  }
  return (JavascriptString *)this_local;
}

Assistant:

JavascriptString * JavascriptRegExpEnumerator::MoveAndGetNext(PropertyId& propertyId, PropertyAttributes* attributes)
    {
        propertyId = Constants::NoProperty;
        ScriptContext* scriptContext = this->GetScriptContext();

        JavascriptString * item = nullptr;
        if (regExpObject->GetSpecialEnumerablePropertyName(++index, &item, scriptContext))
        {
            if (attributes != nullptr)
            {
                *attributes = PropertyEnumerable;
            }
            return item;
        }

        index = regExpObject->GetSpecialEnumerablePropertyCount();
        return nullptr;
    }